

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

int32 __thiscall
rw::PluginList::setStreamRightsCallback(PluginList *this,uint32 id,RightsCallback cb)

{
  uint32 uVar1;
  int32 in_EAX;
  LLLink *pLVar2;
  
  pLVar2 = (this->plugins).link.next;
  do {
    if (pLVar2 == &(this->plugins).link) {
      return -1;
    }
    uVar1 = *(uint32 *)&pLVar2[-5].next;
    if (uVar1 == id) {
      pLVar2[-2].prev = (LLLink *)cb;
      in_EAX = *(int32 *)&pLVar2[-6].prev;
    }
    pLVar2 = pLVar2->next;
  } while (uVar1 != id);
  return in_EAX;
}

Assistant:

int32
PluginList::setStreamRightsCallback(uint32 id, RightsCallback cb)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->rightsCallback = cb;
			return p->offset;
		}
	}
	return -1;
}